

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

Data * QNetworkHeadersPrivate::fromHttpDate(QByteArrayView value)

{
  Data DVar1;
  char cVar2;
  int iVar3;
  qsizetype qVar4;
  QDateTime *pQVar5;
  storage_type *in_RDX;
  void *pvVar6;
  Data *this;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  int year;
  undefined4 uStack_b4;
  QByteArrayView local_b0;
  int day;
  undefined4 uStack_9c;
  QTime local_94;
  QDate local_90;
  int second;
  int minute;
  int hour;
  Data local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QByteArrayView value_local;
  Data local_48 [3];
  long local_30;
  
  value_local.m_size = (qsizetype)value.m_data;
  this = (Data *)value.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar6 = (void *)0x2c;
  value_local.m_data = in_RDX;
  qVar4 = QByteArrayView::indexOf(&value_local,',',0);
  this->d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::QDateTime((QDateTime *)&this->s);
  iVar3 = (int)qVar4;
  if (iVar3 == 3) {
    local_48[0]._0_4_ = 0xaaaaaaaa;
    _day = (undefined1 *)CONCAT44(uStack_9c,0xaaaaaaaa);
    year = 0xaaaaaaaa;
    hour = -0x55555556;
    minute = -0x55555556;
    second = -0x55555556;
    iVar3 = __isoc99_sscanf(value_local.m_data,"%*3s, %d %3s %d %d:%d:%d \'GMT\'");
    if (iVar3 == 6) {
      if ((byte)local_48[0]._0_1_ - 0x41 < 0x13) {
        pQVar5 = (QDateTime *)
                 (*(code *)(&DAT_002410a4 +
                           *(int *)(&DAT_002410a4 + (ulong)((byte)local_48[0]._0_1_ - 0x41) * 4)))()
        ;
        return (Data *)pQVar5;
      }
      QDate::QDate(&local_90,year,0,day);
      QTime::QTime(&local_94,hour,minute,second,0);
      QDateTime::QDateTime((QDateTime *)&local_78,local_90.jd,local_94.mds,1);
      DVar1.s = *(ShortData *)this;
      *this = local_78;
      local_78.s = DVar1.s;
      QDateTime::~QDateTime((QDateTime *)&local_78.s);
    }
  }
  else if (iVar3 == -1) {
    QVar7.m_data = (storage_type *)value_local.m_size;
    QVar7.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar7);
    QDateTime::fromString((QDateTime *)&local_48[0].s,(QString *)&local_78.s,TextDate);
    DVar1.s = *(ShortData *)this;
    *this = local_48[0];
    local_48[0].s = DVar1.s;
    QDateTime::~QDateTime((QDateTime *)&local_48[0].s);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78.s);
  }
  else {
    _day = &DAT_aaaaaaaaaaaaaaaa;
    QLocale::c((QLocale *)&day,pvVar6);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_48[0].d = (QTimeZonePrivate *)(value_local.m_data + (long)iVar3 + 2);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_b0,(char **)&local_48[0].d);
    QVar8.m_data = (storage_type *)local_b0.m_size;
    QVar8.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar8);
    latin1.m_data = "dd-MMM-yy hh:mm:ss \'GMT\'";
    latin1.m_size = 0x18;
    QString::QString((QString *)&local_48[0].s,latin1);
    QLocale::toDateTime((QString *)&year,(QString *)&day,(int)&local_78);
    DVar1.s = *(ShortData *)this;
    *this = _year;
    _year = DVar1.s;
    QDateTime::~QDateTime((QDateTime *)&year);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48[0].s);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78.s);
    QLocale::~QLocale((QLocale *)&day);
  }
  cVar2 = QDateTime::isValid();
  if (cVar2 != '\0') {
    local_78 = (Data)0x2;
    QDateTime::setTimeZone(this,&local_78,1);
    QTimeZone::~QTimeZone((QTimeZone *)&local_78.s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QNetworkHeadersPrivate::fromHttpDate(QByteArrayView value)
{
    // HTTP dates have three possible formats:
    //  RFC 1123/822      -   ddd, dd MMM yyyy hh:mm:ss "GMT"
    //  RFC 850           -   dddd, dd-MMM-yy hh:mm:ss "GMT"
    //  ANSI C's asctime  -   ddd MMM d hh:mm:ss yyyy
    // We only handle them exactly. If they deviate, we bail out.

    int pos = value.indexOf(',');
    QDateTime dt;
#if QT_CONFIG(datestring)
    if (pos == -1) {
        // no comma -> asctime(3) format
        dt = QDateTime::fromString(QString::fromLatin1(value), Qt::TextDate);
    } else {
        // Use sscanf over QLocal/QDateTimeParser for speed reasons. See the
        // Qt WebKit performance benchmarks to get an idea.
        if (pos == 3) {
            char month_name[4];
            int day, year, hour, minute, second;
#ifdef Q_CC_MSVC
            // Use secure version to avoid compiler warning
            if (sscanf_s(value.constData(), "%*3s, %d %3s %d %d:%d:%d 'GMT'", &day, month_name, 4, &year, &hour, &minute, &second) == 6)
#else
            // The POSIX secure mode is %ms (which allocates memory), too bleeding edge for now
            // In any case this is already safe as field width is specified.
            if (sscanf(value.constData(), "%*3s, %d %3s %d %d:%d:%d 'GMT'", &day, month_name, &year, &hour, &minute, &second) == 6)
#endif
                dt = QDateTime(QDate(year, name_to_month(month_name), day), QTime(hour, minute, second));
        } else {
            QLocale c = QLocale::c();
            // eat the weekday, the comma and the space following it
            QString sansWeekday = QString::fromLatin1(value.constData() + pos + 2);
            // must be RFC 850 date
            dt = c.toDateTime(sansWeekday, "dd-MMM-yy hh:mm:ss 'GMT'"_L1);
        }
    }
#endif // datestring

    if (dt.isValid())
        dt.setTimeZone(QTimeZone::UTC);
    return dt;
}